

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O1

void __thiscall gvr::PointCloud::translate(PointCloud *this,Vector3d *v)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int i;
  uint uVar4;
  long lVar5;
  Vector3d *pVVar6;
  Vector3d t;
  SVector<double,_3> ret_1;
  
  pVVar6 = &(this->super_Model).origin;
  t.v[0] = 0.0;
  t.v[1] = 0.0;
  t.v[2] = 0.0;
  lVar5 = 0;
  do {
    t.v[lVar5] = v->v[lVar5] + pVVar6->v[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  auVar2._8_4_ = (int)-(ulong)(t.v[1] != 0.0);
  auVar2._0_8_ = -(ulong)(t.v[0] != 0.0);
  auVar2._12_4_ = (int)(-(ulong)(t.v[1] != 0.0) >> 0x20);
  uVar4 = movmskpd(3,auVar2);
  if (((((uVar4 & 1) != 0) || ((byte)((byte)uVar4 >> 1) != 0)) || (t.v[2] != 0.0)) || (NAN(t.v[2])))
  {
    iVar3 = this->n * 3;
    uVar4 = iVar3 - 3;
    if (-1 < (int)uVar4) {
      pfVar1 = this->vertex;
      lVar5 = (ulong)uVar4 + 3;
      do {
        *(ulong *)(pfVar1 + lVar5 + -3) =
             CONCAT44((float)((ulong)*(undefined8 *)(pfVar1 + lVar5 + -3) >> 0x20) + (float)t.v[1],
                      (float)*(undefined8 *)(pfVar1 + lVar5 + -3) + (float)t.v[0]);
        pfVar1[lVar5 + -1] = pfVar1[lVar5 + -1] + (float)t.v[2];
        lVar5 = lVar5 + -3;
      } while (2 < lVar5);
    }
    pfVar1 = this->scanpos;
    if (-1 < iVar3 + -3 && pfVar1 != (float *)0x0) {
      lVar5 = (ulong)uVar4 + 3;
      do {
        *(ulong *)(pfVar1 + lVar5 + -3) =
             CONCAT44((float)((ulong)*(undefined8 *)(pfVar1 + lVar5 + -3) >> 0x20) + (float)t.v[1],
                      (float)*(undefined8 *)(pfVar1 + lVar5 + -3) + (float)t.v[0]);
        pfVar1[lVar5 + -1] = pfVar1[lVar5 + -1] + (float)t.v[2];
        lVar5 = lVar5 + -3;
      } while (2 < lVar5);
    }
  }
  pVVar6->v[0] = 0.0;
  (this->super_Model).origin.v[1] = 0.0;
  lVar5 = 0;
  (this->super_Model).origin.v[2] = 0.0;
  pVVar6 = &(this->super_Model).Tc;
  ret_1.v[2] = 0.0;
  ret_1.v[0] = 0.0;
  ret_1.v[1] = 0.0;
  do {
    ret_1.v[lVar5] = pVVar6->v[lVar5] + t.v[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  (this->super_Model).Tc.v[2] = ret_1.v[2];
  pVVar6->v[0] = ret_1.v[0];
  (this->super_Model).Tc.v[1] = ret_1.v[1];
  return;
}

Assistant:

const gmath::Vector3d &getOrigin() const { return origin; }